

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
btGImpactCollisionAlgorithm::gimpacttrimeshpart_vs_plane_collision
          (btGImpactCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btGImpactMeshShapePart *shape0,
          btStaticPlaneShape *shape1,bool swapped)

{
  double *pdVar1;
  btTransform *pbVar2;
  long lVar3;
  ulong uVar4;
  btCollisionObjectWrapper *body1Wrap_00;
  int iVar5;
  btCollisionObjectWrapper *body0Wrap_00;
  btVector3 *normal;
  undefined3 in_register_00000089;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btTransform orgtrans0;
  btVector3 local_d0;
  btVector3 local_c0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  btVector3 local_60;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  
  local_ac = CONCAT31(in_register_00000089,swapped);
  pbVar2 = body0Wrap->m_worldTransform;
  local_a8 = *(undefined8 *)(pbVar2->m_basis).m_el[0].m_floats;
  uStack_a0 = *(undefined8 *)((pbVar2->m_basis).m_el[0].m_floats + 2);
  local_98 = *(undefined8 *)(pbVar2->m_basis).m_el[1].m_floats;
  uStack_90 = *(undefined8 *)((pbVar2->m_basis).m_el[1].m_floats + 2);
  local_88 = *(undefined8 *)(pbVar2->m_basis).m_el[2].m_floats;
  uStack_80 = *(undefined8 *)((pbVar2->m_basis).m_el[2].m_floats + 2);
  local_78 = *(undefined8 *)(pbVar2->m_origin).m_floats;
  uStack_70 = *(undefined8 *)((pbVar2->m_origin).m_floats + 2);
  pbVar2 = body1Wrap->m_worldTransform;
  fVar6 = (shape1->m_planeNormal).m_floats[0];
  fVar8 = (shape1->m_planeNormal).m_floats[1];
  fVar7 = (shape1->m_planeNormal).m_floats[2];
  local_c0.m_floats[0] =
       fVar7 * (pbVar2->m_basis).m_el[0].m_floats[2] +
       fVar6 * (pbVar2->m_basis).m_el[0].m_floats[0] + fVar8 * (pbVar2->m_basis).m_el[0].m_floats[1]
  ;
  local_c0.m_floats[1] =
       fVar7 * (pbVar2->m_basis).m_el[1].m_floats[2] +
       fVar6 * (pbVar2->m_basis).m_el[1].m_floats[0] + fVar8 * (pbVar2->m_basis).m_el[1].m_floats[1]
  ;
  local_c0.m_floats[2] =
       (pbVar2->m_basis).m_el[2].m_floats[2] * fVar7 +
       (pbVar2->m_basis).m_el[2].m_floats[0] * fVar6 + (pbVar2->m_basis).m_el[2].m_floats[1] * fVar8
  ;
  local_c0.m_floats[3] =
       (pbVar2->m_origin).m_floats[2] * fVar7 +
       (pbVar2->m_origin).m_floats[0] * fVar6 + (pbVar2->m_origin).m_floats[1] * fVar8 +
       shape1->m_planeConstant;
  (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
    _vptr_btCollisionShape[2])(shape0,&local_a8,&local_50,&local_40);
  (*(shape1->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(shape1);
  fVar6 = (float)local_50 - extraout_XMM0_Da;
  fVar8 = (float)((ulong)local_50 >> 0x20) - extraout_XMM0_Da;
  local_50 = CONCAT44(fVar8,fVar6);
  local_48 = local_48 - extraout_XMM0_Da;
  fVar9 = (float)local_40 + extraout_XMM0_Da;
  fVar10 = (float)((ulong)local_40 >> 0x20) + extraout_XMM0_Da;
  local_40 = CONCAT44(fVar10,fVar9);
  local_38 = extraout_XMM0_Da + local_38;
  fVar7 = (fVar6 + fVar9) * 0.5;
  fVar11 = (fVar8 + fVar10) * 0.5;
  fVar6 = (local_48 + local_38) * 0.5;
  fVar8 = fVar6 * local_c0.m_floats[2] +
          fVar7 * local_c0.m_floats[0] + local_c0.m_floats[1] * fVar11;
  fVar6 = (local_38 - fVar6) * ABS(local_c0.m_floats[2]) +
          (fVar9 - fVar7) * ABS(local_c0.m_floats[0]) +
          ABS(local_c0.m_floats[1]) * (fVar10 - fVar11);
  if ((fVar8 - fVar6 <= local_c0.m_floats[3] + 1e-06) &&
     (local_c0.m_floats[3] <= fVar8 + fVar6 + 1e-06)) {
    (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1c])(shape0);
    (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0xc])(shape0);
    (*(shape1->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape[0xc])(shape1);
    iVar5 = *(int *)&shape0->field_0xf0;
    if (iVar5 != 0) {
      do {
        iVar5 = iVar5 + -1;
        if (*(int *)&shape0->field_0xf4 == 1) {
          uVar4 = (ulong)(uint)(*(int *)&shape0->field_0xf8 * iVar5);
          pdVar1 = (double *)(*(long *)&shape0->field_0xe8 + uVar4);
          local_d0.m_floats[0] =
               (btScalar)((double)(float)*(undefined8 *)&shape0->field_0xd0 * *pdVar1);
          local_d0.m_floats[1] =
               (btScalar)
               ((double)(float)((ulong)*(undefined8 *)&shape0->field_0xd0 >> 0x20) * pdVar1[1]);
          fVar6 = (float)((double)*(float *)&shape0->field_0xd8 *
                         *(double *)(*(long *)&shape0->field_0xe8 + 0x10 + uVar4));
        }
        else {
          lVar3 = *(long *)&shape0->field_0xe8;
          uVar4 = (ulong)(uint)(*(int *)&shape0->field_0xf8 * iVar5);
          local_d0.m_floats[0] = *(float *)(lVar3 + uVar4) * *(float *)&shape0->field_0xd0;
          local_d0.m_floats[1] = *(float *)(lVar3 + 4 + uVar4) * *(float *)&shape0->field_0xd4;
          fVar6 = *(float *)(lVar3 + 8 + uVar4) * *(float *)&shape0->field_0xd8;
        }
        fVar8 = (float)local_78 +
                (float)uStack_a0 * fVar6 +
                (float)local_a8 * local_d0.m_floats[0] + local_a8._4_4_ * local_d0.m_floats[1];
        fVar7 = (float)((ulong)local_78 >> 0x20) +
                (float)uStack_90 * fVar6 +
                (float)local_98 * local_d0.m_floats[0] + local_98._4_4_ * local_d0.m_floats[1];
        fVar6 = (float)uStack_80 * fVar6 +
                (float)local_88 * local_d0.m_floats[0] + local_88._4_4_ * local_d0.m_floats[1] +
                (float)uStack_70;
        local_d0.m_floats[1] = fVar7;
        local_d0.m_floats[0] = fVar8;
        local_d0.m_floats._8_8_ = ZEXT48((uint)fVar6);
        fVar6 = ((fVar6 * local_c0.m_floats[2] +
                 fVar8 * local_c0.m_floats[0] + local_c0.m_floats[1] * fVar7) - local_c0.m_floats[3]
                ) - (extraout_XMM0_Da_00 + extraout_XMM0_Da_01);
        if (fVar6 < 0.0) {
          if ((char)local_ac == '\0') {
            normal = &local_c0;
            body1Wrap_00 = body1Wrap;
            body0Wrap_00 = body0Wrap;
          }
          else {
            uVar4 = CONCAT44(local_c0.m_floats[1],local_c0.m_floats[0]) ^ 0x8000000080000000;
            local_60.m_floats[2] = -local_c0.m_floats[2];
            local_60.m_floats[0] = (btScalar)(int)uVar4;
            local_60.m_floats[1] = (btScalar)(int)(uVar4 >> 0x20);
            local_60.m_floats[3] = 0.0;
            normal = &local_60;
            body1Wrap_00 = body0Wrap;
            body0Wrap_00 = body1Wrap;
          }
          addContactPoint(this,body0Wrap_00,body1Wrap_00,&local_d0,normal,fVar6);
        }
      } while (iVar5 != 0);
    }
    (*(shape0->super_btGImpactShapeInterface).super_btConcaveShape.super_btCollisionShape.
      _vptr_btCollisionShape[0x1d])(shape0);
  }
  return;
}

Assistant:

void btGImpactCollisionAlgorithm::gimpacttrimeshpart_vs_plane_collision(
					  const btCollisionObjectWrapper * body0Wrap,
					  const btCollisionObjectWrapper * body1Wrap,
					  const btGImpactMeshShapePart * shape0,
					  const btStaticPlaneShape * shape1,bool swapped)
{


	btTransform orgtrans0 = body0Wrap->getWorldTransform();
	btTransform orgtrans1 = body1Wrap->getWorldTransform();

	const btPlaneShape * planeshape = static_cast<const btPlaneShape *>(shape1);
	btVector4 plane;
	planeshape->get_plane_equation_transformed(orgtrans1,plane);

	//test box against plane

	btAABB tribox;
	shape0->getAabb(orgtrans0,tribox.m_min,tribox.m_max);
	tribox.increment_margin(planeshape->getMargin());

	if( tribox.plane_classify(plane)!= BT_CONST_COLLIDE_PLANE) return;

	shape0->lockChildShapes();

	btScalar margin = shape0->getMargin() + planeshape->getMargin();

	btVector3 vertex;
	int vi = shape0->getVertexCount();
	while(vi--)
	{
		shape0->getVertex(vi,vertex);
		vertex = orgtrans0(vertex);

		btScalar distance = vertex.dot(plane) - plane[3] - margin;

		if(distance<0.0)//add contact
		{
			if(swapped)
			{
				addContactPoint(body1Wrap, body0Wrap,
					vertex,
					-plane,
					distance);
			}
			else
			{
				addContactPoint(body0Wrap, body1Wrap,
					vertex,
					plane,
					distance);
			}
		}
	}

	shape0->unlockChildShapes();
}